

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall glslang::TIntermediate::promoteBinary(TIntermediate *this,TIntermBinary *node)

{
  TIntermBinary *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  EShSource EVar6;
  TBasicType TVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TQualifier *pTVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int *piVar9;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  TOperator TVar10;
  TType local_640;
  TType local_5a8;
  TType local_510;
  TType local_478;
  TType local_3e0;
  TBasicType local_344;
  undefined1 local_340 [4];
  TBasicType basicType;
  TType local_2a8;
  TType local_210;
  int local_174;
  int local_170;
  int local_16c;
  undefined1 local_168 [4];
  int resultWidth;
  TType local_d0;
  TIntermTyped *local_38;
  TIntermTyped *right;
  TIntermTyped *left;
  TIntermBinary *pTStack_20;
  TOperator op;
  TIntermBinary *node_local;
  TIntermediate *this_local;
  
  pTStack_20 = node;
  node_local = (TIntermBinary *)this;
  left._4_4_ = TIntermOperator::getOp(&node->super_TIntermOperator);
  iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  right = (TIntermTyped *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x33])();
  local_38 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar3);
  uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2a])();
  if (((((uVar4 & 1) != 0) ||
       (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2a])(), (uVar4 & 1) != 0)) ||
      (iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xf)) ||
     (iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xf)) {
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_01,iVar3),
                              (TType *)CONCAT44(extraout_var_02,iVar5));
    if (bVar2) {
      return false;
    }
  }
  pTVar1 = pTStack_20;
  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (pTVar1,CONCAT44(extraout_var_03,iVar3));
  iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x1f])();
  pTVar8 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x50))();
  TQualifier::clear(pTVar8);
  uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2a])();
  if ((((uVar4 & 1) != 0) ||
      (iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xf)) ||
     (iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xe)) {
    if (left._4_4_ - EOpEqual < 2) {
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
      pTVar1 = pTStack_20;
      if (iVar3 != 0xe) {
        TType::TType(&local_d0,EbtBool,EvqTemporary,1,0,0,false);
        (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [0x1d])(pTVar1,&local_d0);
        TType::~TType(&local_d0);
        return true;
      }
      return false;
    }
    if (left._4_4_ == EOpAssign) {
      return true;
    }
    return false;
  }
  EVar6 = getSource(this);
  if (((EVar6 == EShSourceHlsl) &&
      ((iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xc ||
       (iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xc)))) &&
     ((left._4_4_ - EOpAdd < 10 || (left._4_4_ - EOpLessThan < 4)))) {
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if (iVar3 == 0xc) {
      right = createConversion(this,EbtInt,right);
    }
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if (iVar3 == 0xc) {
      local_38 = createConversion(this,EbtInt,local_38);
    }
    if ((right == (TIntermTyped *)0x0) || (local_38 == (TIntermTyped *)0x0)) {
      return false;
    }
    (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x30])(pTStack_20,right);
    (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(pTStack_20,local_38);
    pTVar1 = pTStack_20;
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar1,CONCAT44(extraout_var_05,iVar3));
    iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x1f])();
    pTVar8 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x50))();
    TQualifier::clear(pTVar8);
  }
  if (left._4_4_ - EOpAdd < 4) {
LAB_007416b6:
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if ((iVar3 == 0xc) ||
       (iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 0xc)) {
      return false;
    }
  }
  else if (left._4_4_ - EOpMod < 6) {
LAB_00741638:
    EVar6 = getSource(this);
    if (EVar6 != EShSourceHlsl) {
      TVar7 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
      bVar2 = isTypeInt(TVar7);
      if (!bVar2) {
        TVar7 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])();
        bVar2 = isTypeInt(TVar7);
        if (!bVar2) {
          return false;
        }
      }
      uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
      if (((uVar4 & 1) != 0) ||
         (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(), (uVar4 & 1) != 0)) {
        return false;
      }
    }
  }
  else if (left._4_4_ - EOpEqual < 2) {
    EVar6 = getSource(this);
    pTVar1 = pTStack_20;
    if (EVar6 == EShSourceHlsl) {
      local_170 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
      local_174 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
      piVar9 = std::max<int>(&local_170,&local_174);
      local_16c = *piVar9;
      if (1 < local_16c) {
        bVar2 = left._4_4_ == EOpEqual;
        left._4_4_ = EOpVectorNotEqual;
        if (bVar2) {
          left._4_4_ = EOpVectorEqual;
        }
        TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,left._4_4_);
      }
      pTVar1 = pTStack_20;
      TType::TType(&local_210,EbtBool,EvqTemporary,local_16c,0,0,false);
      (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar1,&local_210);
      TType::~TType(&local_210);
    }
    else {
      TType::TType(&local_2a8,EbtBool,EvqTemporary,1,0,0,false);
      (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d]
      )(pTVar1,&local_2a8);
      TType::~TType(&local_2a8);
    }
  }
  else if (left._4_4_ - EOpLessThan < 4) {
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
    pTVar1 = pTStack_20;
    if (iVar3 == 0xc) {
      return false;
    }
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
    TType::TType((TType *)local_168,EbtBool,EvqTemporary,iVar3,0,0,false);
    (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar1,local_168);
    TType::~TType((TType *)local_168);
  }
  else if (left._4_4_ - EOpLogicalOr < 3) {
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if ((iVar3 != 0xc) ||
       (uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])(), (uVar4 & 1) != 0)) {
      return false;
    }
    EVar6 = getSource(this);
    if ((EVar6 == EShSourceGlsl) &&
       (uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (uVar4 & 1) != 0)) {
      return false;
    }
    pTVar1 = pTStack_20;
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
    TType::TType((TType *)local_340,EbtBool,EvqTemporary,iVar3,0,0,false);
    (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar1,local_340);
    TType::~TType((TType *)local_340);
  }
  else {
    if ((left._4_4_ - EOpAddAssign < 3) || (left._4_4_ == EOpDivAssign)) goto LAB_007416b6;
    if (left._4_4_ - EOpModAssign < 6) goto LAB_00741638;
  }
  if (left._4_4_ - EOpAdd < 2) goto LAB_007417cb;
  if (left._4_4_ == EOpMul) {
LAB_0074180c:
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
    iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if (iVar3 != iVar5) {
      return false;
    }
  }
  else {
    if ((left._4_4_ - EOpDiv < 2) || (left._4_4_ - EOpAnd < 3)) {
LAB_007417cb:
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_09,iVar3),
                                (TType *)CONCAT44(extraout_var_10,iVar5));
      if (bVar2) {
        return true;
      }
      goto LAB_0074180c;
    }
    if ((left._4_4_ - EOpEqual < 8) || (left._4_4_ - EOpLogicalOr < 3)) {
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_07,iVar3),
                                (TType *)CONCAT44(extraout_var_08,iVar5));
      return bVar2;
    }
    if (left._4_4_ - EOpAddAssign < 2) goto LAB_007417cb;
    if (left._4_4_ == EOpMulAssign) goto LAB_0074180c;
    if (left._4_4_ - EOpDivAssign < 5) goto LAB_007417cb;
  }
  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_11,iVar3));
  if (!bVar2) {
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_12,iVar3));
    if (!bVar2) {
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_26,iVar3));
      if (!bVar2) {
        iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_27,iVar3));
        if (!bVar2) {
          uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2c])();
          if (((uVar4 & 1) != 0) &&
             (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2c])(), (uVar4 & 1) != 0))
          {
            return true;
          }
          uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
          if (((uVar4 & 1) != 0) &&
             (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (uVar4 & 1) != 0))
          {
            iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
            iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
            if ((iVar3 != iVar5) &&
               (iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])(), 1 < iVar3)) {
              return false;
            }
          }
          local_344 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
          if (1 < left._4_4_ - EOpAdd) {
            if (left._4_4_ == EOpMul) {
              uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
              if (((uVar4 & 1) == 0) &&
                 (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                 (uVar4 & 1) != 0)) {
                uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                if ((uVar4 & 1) == 0) {
                  left._4_4_ = EOpMatrixTimesScalar;
                  TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,EOpMatrixTimesScalar);
                  pTVar1 = pTStack_20;
                  TVar7 = local_344;
                  iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                  iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                  TType::TType(&local_478,TVar7,EvqTemporary,0,iVar3,iVar5,false);
                  (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1d])(pTVar1,&local_478);
                  TType::~TType(&local_478);
                }
                else {
                  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
                  iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                  if (iVar3 != iVar5) {
                    return false;
                  }
                  left._4_4_ = EOpVectorTimesMatrix;
                  TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,EOpVectorTimesMatrix);
                  pTVar1 = pTStack_20;
                  TVar7 = local_344;
                  iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                  TType::TType(&local_3e0,TVar7,EvqTemporary,iVar3,0,0,false);
                  (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1d])(pTVar1,&local_3e0);
                  TType::~TType(&local_3e0);
                }
              }
              else {
                uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                if (((uVar4 & 1) == 0) ||
                   (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                   (uVar4 & 1) != 0)) {
                  uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                  if (((uVar4 & 1) == 0) ||
                     (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                     (uVar4 & 1) == 0)) {
                    uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                    if (((uVar4 & 1) != 0) ||
                       (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                       (uVar4 & 1) != 0)) {
                      return false;
                    }
                    uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                    if ((((uVar4 & 1) == 0) ||
                        (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                        (uVar4 & 1) == 0)) &&
                       ((uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                        (uVar4 & 1) != 0 ||
                        (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                        (uVar4 & 1) != 0)))) {
                      left._4_4_ = EOpVectorTimesScalar;
                      TIntermOperator::setOp
                                (&pTStack_20->super_TIntermOperator,EOpVectorTimesScalar);
                      uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                      pTVar1 = pTStack_20;
                      TVar7 = local_344;
                      if ((uVar4 & 1) != 0) {
                        iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
                        TType::TType(&local_640,TVar7,EvqTemporary,iVar3,0,0,false);
                        (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1d])(pTVar1,&local_640);
                        TType::~TType(&local_640);
                      }
                    }
                  }
                  else {
                    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x27])();
                    iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                    if (iVar3 != iVar5) {
                      return false;
                    }
                    left._4_4_ = EOpMatrixTimesMatrix;
                    TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,EOpMatrixTimesMatrix);
                    pTVar1 = pTStack_20;
                    TVar7 = local_344;
                    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                    iVar5 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x28])();
                    TType::TType(&local_5a8,TVar7,EvqTemporary,0,iVar3,iVar5,false);
                    (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1d])(pTVar1,&local_5a8);
                    TType::~TType(&local_5a8);
                  }
                }
                else {
                  uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                  if ((uVar4 & 1) == 0) {
                    left._4_4_ = EOpMatrixTimesScalar;
                    TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,EOpMatrixTimesScalar);
                  }
                  else {
                    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x27])();
                    iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
                    if (iVar3 != iVar5) {
                      return false;
                    }
                    left._4_4_ = EOpMatrixTimesVector;
                    TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,EOpMatrixTimesVector);
                    pTVar1 = pTStack_20;
                    TVar7 = local_344;
                    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x28])();
                    TType::TType(&local_510,TVar7,EvqTemporary,iVar3,0,0,false);
                    (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1d])(pTVar1,&local_510);
                    TType::~TType(&local_510);
                  }
                }
              }
              goto LAB_0074285f;
            }
            if (1 < left._4_4_ - EOpDiv) {
              if (left._4_4_ - EOpRightShift < 2) {
LAB_00742597:
                uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                if ((uVar4 & 1) != 0) {
                  uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                  if ((uVar4 & 1) != 0) {
                    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
                    iVar5 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
                    if (iVar3 == iVar5) goto LAB_0074285f;
                  }
                  return false;
                }
                goto LAB_0074285f;
              }
              if (2 < left._4_4_ - EOpAnd) {
                if (left._4_4_ == EOpAssign) {
                  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
                  iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
                  if (iVar3 != iVar5) {
                    return false;
                  }
                  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x27])();
                  iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                  if (iVar3 != iVar5) {
                    return false;
                  }
                  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x28])();
                  iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                  if (iVar3 != iVar5) {
                    return false;
                  }
                }
                else if (1 < left._4_4_ - EOpAddAssign) {
                  if (left._4_4_ == EOpMulAssign) {
                    uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                    if (((uVar4 & 1) == 0) &&
                       (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                       (uVar4 & 1) != 0)) {
                      uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                      if ((uVar4 & 1) == 0) {
                        return false;
                      }
                      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
                      iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                      if (iVar3 == iVar5) {
                        iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
                        iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                        if (iVar3 == iVar5) {
                          left._4_4_ = EOpVectorTimesMatrixAssign;
                          TIntermOperator::setOp
                                    (&pTStack_20->super_TIntermOperator,EOpVectorTimesMatrixAssign);
                          goto LAB_0074285f;
                        }
                      }
                      return false;
                    }
                    uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                    if (((uVar4 & 1) == 0) ||
                       (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                       (uVar4 & 1) != 0)) {
                      uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                      if (((uVar4 & 1) != 0) &&
                         (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                         (uVar4 & 1) != 0)) {
                        iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x27])();
                        iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                        if (iVar3 == iVar5) {
                          iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x27])();
                          iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                          if (iVar3 == iVar5) {
                            left._4_4_ = EOpMatrixTimesMatrixAssign;
                            TIntermOperator::setOp
                                      (&pTStack_20->super_TIntermOperator,EOpMatrixTimesMatrixAssign
                                      );
                            goto LAB_0074285f;
                          }
                        }
                        return false;
                      }
                      uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
                      if (((uVar4 & 1) != 0) ||
                         (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                         (uVar4 & 1) != 0)) {
                        return false;
                      }
                      uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                      if ((((uVar4 & 1) == 0) ||
                          (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                          (uVar4 & 1) == 0)) &&
                         ((uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                          (uVar4 & 1) != 0 ||
                          (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                          (uVar4 & 1) != 0)))) {
                        uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                        if ((uVar4 & 1) == 0) {
                          return false;
                        }
                        left._4_4_ = EOpVectorTimesScalarAssign;
                        TIntermOperator::setOp
                                  (&pTStack_20->super_TIntermOperator,EOpVectorTimesScalarAssign);
                      }
                    }
                    else {
                      uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])();
                      if ((uVar4 & 1) != 0) {
                        return false;
                      }
                      left._4_4_ = EOpMatrixTimesScalarAssign;
                      TIntermOperator::setOp
                                (&pTStack_20->super_TIntermOperator,EOpMatrixTimesScalarAssign);
                    }
                    goto LAB_0074285f;
                  }
                  if (4 < left._4_4_ - EOpDivAssign) {
                    if (1 < left._4_4_ - EOpLeftShiftAssign) {
                      return false;
                    }
                    goto LAB_00742597;
                  }
                }
              }
            }
          }
          uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
          if ((((uVar4 & 1) == 0) ||
              (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(), (uVar4 & 1) == 0)
              ) && ((uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                    (uVar4 & 1) == 0 ||
                    (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                    (uVar4 & 1) == 0)))) {
            iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])();
            iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x20])();
            if (iVar3 == iVar5) {
              uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x29])();
              if (((uVar4 & 1) != 0) &&
                 (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                 (uVar4 & 1) != 0)) {
                iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x27])();
                iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x27])();
                if (iVar3 != iVar5) {
                  return false;
                }
                iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x28])();
                iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x28])();
                if (iVar3 != iVar5) {
                  return false;
                }
              }
              uVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2b])();
              if (((uVar4 & 1) != 0) &&
                 (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])(),
                 (uVar4 & 1) != 0)) {
                iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x26])();
                iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x26])();
                if (iVar3 != iVar5) {
                  return false;
                }
              }
              uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x2b])();
              if (((uVar4 & 1) != 0) ||
                 (uVar4 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x29])(),
                 (uVar4 & 1) != 0)) {
                iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1f])();
                iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
                TType::shallowCopy((TType *)CONCAT44(extraout_var_38,iVar3),
                                   (TType *)CONCAT44(extraout_var_39,iVar5));
                iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1f])();
                pTVar8 = (TQualifier *)
                         (**(code **)(*(long *)CONCAT44(extraout_var_40,iVar3) + 0x50))();
                TQualifier::makeTemporary(pTVar8);
              }
LAB_0074285f:
              if ((left._4_4_ - EOpAssign < 4) || (left._4_4_ - EOpDivAssign < 7)) {
                iVar3 = (*(pTStack_20->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                iVar5 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
                bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_41,iVar3),
                                          (TType *)CONCAT44(extraout_var_42,iVar5));
                if (bVar2) {
                  return false;
                }
              }
              return true;
            }
          }
          return false;
        }
      }
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_28,iVar3));
      if (bVar2) {
        iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_29,iVar3));
        if (bVar2) {
          iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_30,iVar3),
                                    (TType *)CONCAT44(extraout_var_31,iVar5));
          if (bVar2) {
            return false;
          }
        }
      }
      if (left._4_4_ - EOpAdd < 2) goto LAB_00741c7d;
      if (left._4_4_ != EOpMul) {
        if (((left._4_4_ == EOpDiv) || (left._4_4_ - EOpRightShift < 2)) ||
           (left._4_4_ == EOpAssign)) {
LAB_00741c7d:
          iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_36,iVar3));
          if (bVar2) {
            iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_37,iVar3));
            if (bVar2) {
              return true;
            }
          }
          return false;
        }
        if (left._4_4_ != EOpMulAssign) {
          if (1 < left._4_4_ - EOpLeftShiftAssign) {
            return false;
          }
          goto LAB_00741c7d;
        }
      }
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_32,iVar3));
      if (bVar2) {
        iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_33,iVar3));
        if (bVar2) goto LAB_00741c2e;
      }
      TVar10 = EOpVectorTimesScalar;
      if (left._4_4_ == EOpMulAssign) {
        TVar10 = EOpVectorTimesScalarAssign;
      }
      TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,TVar10);
LAB_00741c2e:
      iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::isCoopVecNV((TType *)CONCAT44(extraout_var_34,iVar3));
      pTVar1 = pTStack_20;
      if (bVar2) {
        iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [0x1d])(pTVar1,CONCAT44(extraout_var_35,iVar3));
      }
      return true;
    }
  }
  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_13,iVar3));
  if (bVar2) {
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_14,iVar3));
    if (bVar2) {
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      iVar5 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::operator!=((TType *)CONCAT44(extraout_var_15,iVar3),
                                (TType *)CONCAT44(extraout_var_16,iVar5));
      if (bVar2) {
        return false;
      }
    }
  }
  if (left._4_4_ - EOpAdd < 2) {
LAB_00741a5a:
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_24,iVar3));
    if (bVar2) {
      iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_25,iVar3));
      if (bVar2) {
        return true;
      }
    }
    return false;
  }
  if (left._4_4_ != EOpMul) {
    if ((left._4_4_ == EOpDiv) || (left._4_4_ == EOpAssign)) goto LAB_00741a5a;
    if (left._4_4_ != EOpMulAssign) {
      return false;
    }
  }
  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::isCoopMatNV((TType *)CONCAT44(extraout_var_17,iVar3));
  if (bVar2) {
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::isCoopMatNV((TType *)CONCAT44(extraout_var_18,iVar3));
    if (bVar2) {
      return false;
    }
  }
  if (left._4_4_ == EOpMulAssign) {
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::isCoopMatNV((TType *)CONCAT44(extraout_var_19,iVar3));
    if (bVar2) {
      return false;
    }
  }
  iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_20,iVar3));
  if (bVar2) {
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_21,iVar3));
    if (bVar2) goto LAB_00741a0b;
  }
  TVar10 = EOpMatrixTimesScalar;
  if (left._4_4_ == EOpMulAssign) {
    TVar10 = EOpMatrixTimesScalarAssign;
  }
  TIntermOperator::setOp(&pTStack_20->super_TIntermOperator,TVar10);
LAB_00741a0b:
  iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::isCoopMat((TType *)CONCAT44(extraout_var_22,iVar3));
  pTVar1 = pTStack_20;
  if (bVar2) {
    iVar3 = (*(local_38->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    (*(pTVar1->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar1,CONCAT44(extraout_var_23,iVar3));
  }
  return true;
}

Assistant:

bool TIntermediate::promoteBinary(TIntermBinary& node)
{
    TOperator     op    = node.getOp();
    TIntermTyped* left  = node.getLeft();
    TIntermTyped* right = node.getRight();

    // Arrays and structures have to be exact matches.
    if ((left->isArray() || right->isArray() || left->getBasicType() == EbtStruct || right->getBasicType() == EbtStruct)
        && left->getType() != right->getType())
        return false;

    // Base assumption:  just make the type the same as the left
    // operand.  Only deviations from this will be coded.
    node.setType(left->getType());
    node.getWritableType().getQualifier().clear();

    // Composite and opaque types don't having pending operator changes, e.g.,
    // array, structure, and samplers.  Just establish final type and correctness.
    if (left->isArray() || left->getBasicType() == EbtStruct || left->getBasicType() == EbtSampler) {
        switch (op) {
        case EOpEqual:
        case EOpNotEqual:
            if (left->getBasicType() == EbtSampler) {
                // can't compare samplers
                return false;
            } else {
                // Promote to conditional
                node.setType(TType(EbtBool));
            }

            return true;

        case EOpAssign:
            // Keep type from above

            return true;

        default:
            return false;
        }
    }

    //
    // We now have only scalars, vectors, and matrices to worry about.
    //

    // HLSL implicitly promotes bool -> int for numeric operations.
    // (Implicit conversions to make the operands match each other's types were already done.)
    if (getSource() == EShSourceHlsl &&
        (left->getBasicType() == EbtBool || right->getBasicType() == EbtBool)) {
        switch (op) {
        case EOpLessThan:
        case EOpGreaterThan:
        case EOpLessThanEqual:
        case EOpGreaterThanEqual:

        case EOpRightShift:
        case EOpLeftShift:

        case EOpMod:

        case EOpAnd:
        case EOpInclusiveOr:
        case EOpExclusiveOr:

        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpMul:
            if (left->getBasicType() == EbtBool)
                left  = createConversion(EbtInt, left);
            if (right->getBasicType() == EbtBool)
                right = createConversion(EbtInt, right);
            if (left == nullptr || right == nullptr)
                return false;
            node.setLeft(left);
            node.setRight(right);

            // Update the original base assumption on result type..
            node.setType(left->getType());
            node.getWritableType().getQualifier().clear();

            break;

        default:
            break;
        }
    }

    // Do general type checks against individual operands (comparing left and right is coming up, checking mixed shapes after that)
    switch (op) {
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:
        // Relational comparisons need numeric types and will promote to scalar Boolean.
        if (left->getBasicType() == EbtBool)
            return false;

        node.setType(TType(EbtBool, EvqTemporary, left->getVectorSize()));
        break;

    case EOpEqual:
    case EOpNotEqual:
        if (getSource() == EShSourceHlsl) {
            const int resultWidth = std::max(left->getVectorSize(), right->getVectorSize());

            // In HLSL, == or != on vectors means component-wise comparison.
            if (resultWidth > 1) {
                op = (op == EOpEqual) ? EOpVectorEqual : EOpVectorNotEqual;
                node.setOp(op);
            }

            node.setType(TType(EbtBool, EvqTemporary, resultWidth));
        } else {
            // All the above comparisons result in a bool (but not the vector compares)
            node.setType(TType(EbtBool));
        }
        break;

    case EOpLogicalAnd:
    case EOpLogicalOr:
    case EOpLogicalXor:
        // logical ops operate only on Booleans or vectors of Booleans.
        if (left->getBasicType() != EbtBool || left->isMatrix())
                return false;

        if (getSource() == EShSourceGlsl) {
            // logical ops operate only on scalar Booleans and will promote to scalar Boolean.
            if (left->isVector())
                return false;
        }

        node.setType(TType(EbtBool, EvqTemporary, left->getVectorSize()));
        break;

    case EOpRightShift:
    case EOpLeftShift:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:

    case EOpMod:
    case EOpModAssign:

    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
        if (getSource() == EShSourceHlsl)
            break;

        // Check for integer-only operands.
        if (!isTypeInt(left->getBasicType()) && !isTypeInt(right->getBasicType()))
            return false;
        if (left->isMatrix() || right->isMatrix())
            return false;

        break;

    case EOpAdd:
    case EOpSub:
    case EOpDiv:
    case EOpMul:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpDivAssign:
        // check for non-Boolean operands
        if (left->getBasicType() == EbtBool || right->getBasicType() == EbtBool)
            return false;
        break;

    default:
        break;
    }

    // Compare left and right, and finish with the cases where the operand types must match
    switch (op) {
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:

    case EOpEqual:
    case EOpNotEqual:
    case EOpVectorEqual:
    case EOpVectorNotEqual:

    case EOpLogicalAnd:
    case EOpLogicalOr:
    case EOpLogicalXor:
        return left->getType() == right->getType();

    case EOpMod:
    case EOpModAssign:

    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

    case EOpAdd:
    case EOpSub:
    case EOpDiv:

    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
        // Quick out in case the types do match
        if (left->getType() == right->getType())
            return true;

        [[fallthrough]];

    case EOpMul:
    case EOpMulAssign:
        // At least the basic type has to match
        if (left->getBasicType() != right->getBasicType())
            return false;
        break;

    default:
        break;
    }

    if (left->getType().isCoopMat() || right->getType().isCoopMat()) {
        // Operations on two cooperative matrices must have identical types
        if (left->getType().isCoopMat() && right->getType().isCoopMat() &&
            left->getType() != right->getType()) {
            return false;
        }
        switch (op) {
        case EOpMul:
        case EOpMulAssign:
            // Mul not supported in NV_cooperative_matrix
            if (left->getType().isCoopMatNV() && right->getType().isCoopMatNV()) {
                return false;
            }
            // NV_cooperative_matrix supports MulAssign is for mat*=scalar only.
            // KHR_cooperative_matrix supports it for mat*=mat as well.
            if (op == EOpMulAssign && right->getType().isCoopMatNV()) {
                return false;
            }
            // Use MatrixTimesScalar if either operand is not a matrix. Otherwise use Mul.
            if (!left->getType().isCoopMat() || !right->getType().isCoopMat()) {
                node.setOp(op == EOpMulAssign ? EOpMatrixTimesScalarAssign : EOpMatrixTimesScalar);
            }
            // In case of scalar*matrix, take the result type from the matrix.
            if (right->getType().isCoopMat()) {
                node.setType(right->getType());
            }
            return true;
        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpAssign:
            // These require both to be cooperative matrices
            if (!left->getType().isCoopMat() || !right->getType().isCoopMat()) {
                return false;
            }
            return true;
        default:
            break;
        }
        return false;
    }

    if (left->getType().isCoopVecNV() || right->getType().isCoopVecNV()) {
        // Operations on two cooperative vectors must have identical types
        if (left->getType().isCoopVecNV() && right->getType().isCoopVecNV() &&
            left->getType() != right->getType()) {
            return false;
        }
        switch (op) {
        case EOpMul:
        case EOpMulAssign:
            // Use VectorTimesScalar if either operand is not a vector. Otherwise use Mul.
            if (!left->getType().isCoopVecNV() || !right->getType().isCoopVecNV()) {
                node.setOp(op == EOpMulAssign ? EOpVectorTimesScalarAssign : EOpVectorTimesScalar);
            }
            // In case of scalar*vector, take the result type from the vector.
            if (right->getType().isCoopVecNV()) {
                node.setType(right->getType());
            }
            return true;
        case EOpLeftShift:
        case EOpLeftShiftAssign:
        case EOpRightShift:
        case EOpRightShiftAssign:
        case EOpAdd:
        case EOpSub:
        case EOpDiv:
        case EOpAssign:
            // These require both to be cooperative vectors
            if (!left->getType().isCoopVecNV() || !right->getType().isCoopVecNV()) {
                return false;
            }
            return true;
        default:
            break;
        }
        return false;
    }

    // Finish handling the case, for all ops, where both operands are scalars.
    if (left->isScalar() && right->isScalar())
        return true;

    // Finish handling the case, for all ops, where there are two vectors of different sizes
    if (left->isVector() && right->isVector() && left->getVectorSize() != right->getVectorSize() && right->getVectorSize() > 1)
        return false;

    //
    // We now have a mix of scalars, vectors, or matrices, for non-relational operations.
    //

    // Can these two operands be combined, what is the resulting type?
    TBasicType basicType = left->getBasicType();
    switch (op) {
    case EOpMul:
        if (!left->isMatrix() && right->isMatrix()) {
            if (left->isVector()) {
                if (left->getVectorSize() != right->getMatrixRows())
                    return false;
                node.setOp(op = EOpVectorTimesMatrix);
                node.setType(TType(basicType, EvqTemporary, right->getMatrixCols()));
            } else {
                node.setOp(op = EOpMatrixTimesScalar);
                node.setType(TType(basicType, EvqTemporary, 0, right->getMatrixCols(), right->getMatrixRows()));
            }
        } else if (left->isMatrix() && !right->isMatrix()) {
            if (right->isVector()) {
                if (left->getMatrixCols() != right->getVectorSize())
                    return false;
                node.setOp(op = EOpMatrixTimesVector);
                node.setType(TType(basicType, EvqTemporary, left->getMatrixRows()));
            } else {
                node.setOp(op = EOpMatrixTimesScalar);
            }
        } else if (left->isMatrix() && right->isMatrix()) {
            if (left->getMatrixCols() != right->getMatrixRows())
                return false;
            node.setOp(op = EOpMatrixTimesMatrix);
            node.setType(TType(basicType, EvqTemporary, 0, right->getMatrixCols(), left->getMatrixRows()));
        } else if (! left->isMatrix() && ! right->isMatrix()) {
            if (left->isVector() && right->isVector()) {
                ; // leave as component product
            } else if (left->isVector() || right->isVector()) {
                node.setOp(op = EOpVectorTimesScalar);
                if (right->isVector())
                    node.setType(TType(basicType, EvqTemporary, right->getVectorSize()));
            }
        } else {
            return false;
        }
        break;
    case EOpMulAssign:
        if (! left->isMatrix() && right->isMatrix()) {
            if (left->isVector()) {
                if (left->getVectorSize() != right->getMatrixRows() || left->getVectorSize() != right->getMatrixCols())
                    return false;
                node.setOp(op = EOpVectorTimesMatrixAssign);
            } else {
                return false;
            }
        } else if (left->isMatrix() && !right->isMatrix()) {
            if (right->isVector()) {
                return false;
            } else {
                node.setOp(op = EOpMatrixTimesScalarAssign);
            }
        } else if (left->isMatrix() && right->isMatrix()) {
            if (left->getMatrixCols() != right->getMatrixCols() || left->getMatrixCols() != right->getMatrixRows())
                return false;
            node.setOp(op = EOpMatrixTimesMatrixAssign);
        } else if (!left->isMatrix() && !right->isMatrix()) {
            if (left->isVector() && right->isVector()) {
                // leave as component product
            } else if (left->isVector() || right->isVector()) {
                if (! left->isVector())
                    return false;
                node.setOp(op = EOpVectorTimesScalarAssign);
            }
        } else {
            return false;
        }
        break;

    case EOpRightShift:
    case EOpLeftShift:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:
        if (right->isVector() && (! left->isVector() || right->getVectorSize() != left->getVectorSize()))
            return false;
        break;

    case EOpAssign:
        if (left->getVectorSize() != right->getVectorSize() || left->getMatrixCols() != right->getMatrixCols() || left->getMatrixRows() != right->getMatrixRows())
            return false;
        [[fallthrough]];

    case EOpAdd:
    case EOpSub:
    case EOpDiv:
    case EOpMod:
    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:

        if ((left->isMatrix() && right->isVector()) ||
            (left->isVector() && right->isMatrix()) ||
            left->getBasicType() != right->getBasicType())
            return false;
        if (left->isMatrix() && right->isMatrix() && (left->getMatrixCols() != right->getMatrixCols() || left->getMatrixRows() != right->getMatrixRows()))
            return false;
        if (left->isVector() && right->isVector() && left->getVectorSize() != right->getVectorSize())
            return false;
        if (right->isVector() || right->isMatrix()) {
            node.getWritableType().shallowCopy(right->getType());
            node.getWritableType().getQualifier().makeTemporary();
        }
        break;

    default:
        return false;
    }

    //
    // One more check for assignment.
    //
    switch (op) {
    // The resulting type has to match the left operand.
    case EOpAssign:
    case EOpAddAssign:
    case EOpSubAssign:
    case EOpMulAssign:
    case EOpDivAssign:
    case EOpModAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
    case EOpLeftShiftAssign:
    case EOpRightShiftAssign:
        if (node.getType() != left->getType())
            return false;
        break;
    default:
        break;
    }

    return true;
}